

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_6::TwoLevelIterator::~TwoLevelIterator(TwoLevelIterator *this)

{
  Iterator *pIVar1;
  
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__TwoLevelIterator_0016da98;
  std::__cxx11::string::_M_dispose();
  pIVar1 = (this->data_iter_).iter_;
  if (pIVar1 != (Iterator *)0x0) {
    (*pIVar1->_vptr_Iterator[1])();
  }
  pIVar1 = (this->index_iter_).iter_;
  if (pIVar1 != (Iterator *)0x0) {
    (*pIVar1->_vptr_Iterator[1])();
  }
  Status::~Status(&this->status_);
  Iterator::~Iterator(&this->super_Iterator);
  return;
}

Assistant:

TwoLevelIterator::~TwoLevelIterator() = default;